

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O1

void glfwSetWindowIcon(GLFWwindow *handle,int count,GLFWimage *images)

{
  undefined8 in_RAX;
  
  if (handle == (GLFWwindow *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/src/window.c"
                  ,0x1fa,"void glfwSetWindowIcon(GLFWwindow *, int, const GLFWimage *)");
  }
  if (count < 0) {
    __assert_fail("count >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/src/window.c"
                  ,0x1fb,"void glfwSetWindowIcon(GLFWwindow *, int, const GLFWimage *)");
  }
  if (images == (GLFWimage *)0x0 && count != 0) {
    __assert_fail("count == 0 || images != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/src/window.c"
                  ,0x1fc,"void glfwSetWindowIcon(GLFWwindow *, int, const GLFWimage *)");
  }
  if (_glfw.initialized != 0) {
    _glfwPlatformSetWindowIcon((_GLFWwindow *)handle,count,images);
    return;
  }
  _glfwInputError(0x10001,(char *)0x0,images,in_RAX);
  return;
}

Assistant:

GLFWAPI void glfwSetWindowIcon(GLFWwindow* handle,
                               int count, const GLFWimage* images)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);
    assert(count >= 0);
    assert(count == 0 || images != NULL);

    _GLFW_REQUIRE_INIT();
    _glfwPlatformSetWindowIcon(window, count, images);
}